

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_verify_topo(REF_GRID ref_grid)

{
  int node0;
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_ADJ pRVar2;
  REF_CELL ref_cell;
  REF_INT *pRVar3;
  bool bVar4;
  REF_GRID pRVar5;
  uint uVar6;
  ulong uVar7;
  REF_BOOL RVar8;
  ulong uVar9;
  long lVar10;
  undefined8 uVar11;
  REF_INT RVar12;
  char *pcVar13;
  bool bVar14;
  int iVar15;
  long lVar16;
  REF_INT node;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  REF_INT ncell;
  REF_BOOL geom_face;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_GRID local_48;
  REF_INT cell_list [2];
  
  pRVar1 = ref_grid->node;
  ref_geom = ref_grid->geom;
  uVar17 = 0;
  uVar7 = (ulong)(uint)pRVar1->max;
  if (pRVar1->max < 1) {
    uVar7 = uVar17;
  }
  local_48 = ref_grid;
  for (; pRVar5 = local_48, uVar17 != uVar7; uVar17 = uVar17 + 1) {
    if (pRVar1->global[uVar17] < 0) {
      if (((long)uVar17 < (long)ref_geom->ref_adj->nnode) &&
         (ref_geom->ref_adj->first[uVar17] != -1)) {
        pcVar13 = "invalid node has geom";
        uVar11 = 0x818;
        goto LAB_00156fc9;
      }
    }
    else {
      node = (REF_INT)uVar17;
      ref_geom_is_a(ref_geom,node,0,&geom_node);
      ref_geom_is_a(ref_geom,node,1,&geom_edge);
      ref_geom_is_a(ref_geom,node,2,&geom_face);
      pRVar2 = pRVar5->cell[3]->ref_adj;
      if (((((long)uVar17 < (long)pRVar2->nnode) && (pRVar2->first[uVar17] != -1)) ||
          ((pRVar2 = pRVar5->cell[4]->ref_adj, (long)uVar17 < (long)pRVar2->nnode &&
           (pRVar2->first[uVar17] != -1)))) ||
         ((pRVar2 = pRVar5->cell[5]->ref_adj, (long)uVar17 < (long)pRVar2->nnode &&
          (pRVar2->first[uVar17] != -1)))) {
        bVar19 = false;
      }
      else {
        pRVar2 = pRVar5->cell[6]->ref_adj;
        bVar19 = true;
        if ((long)uVar17 < (long)pRVar2->nnode) {
          bVar19 = pRVar2->first[uVar17] == -1;
        }
      }
      pRVar2 = pRVar5->cell[0]->ref_adj;
      if ((((long)uVar17 < (long)pRVar2->nnode) && (pRVar2->first[uVar17] != -1)) ||
         ((pRVar2 = pRVar5->cell[1]->ref_adj, (long)uVar17 < (long)pRVar2->nnode &&
          (pRVar2->first[uVar17] != -1)))) {
        bVar18 = false;
LAB_0015661e:
        if (geom_node == 0) {
          RVar8 = 0;
        }
        else {
          if (bVar18) {
LAB_00156666:
            bVar18 = true;
            if (pRVar1->ref_mpi->id == pRVar1->part[uVar17]) {
              pcVar13 = "geom node missing edge";
              uVar11 = 0x7c2;
              goto LAB_00156fc9;
            }
          }
          else {
            bVar18 = false;
          }
          RVar8 = geom_node;
          if ((bVar19) && (pRVar1->ref_mpi->id == pRVar1->part[uVar17])) {
            pcVar13 = "geom node missing tri or qua";
            uVar11 = 0x7c5;
            goto LAB_00156fc9;
          }
        }
        if (geom_edge == 0) {
          bVar14 = true;
          bVar4 = false;
          goto LAB_001566e3;
        }
        if (bVar18) {
LAB_001566a3:
          bVar18 = true;
          if (pRVar1->ref_mpi->id == pRVar1->part[uVar17]) {
            uVar6 = ref_grid_tattle(pRVar5,node);
            if (uVar6 == 0) {
              uVar6 = ref_geom_tec_para_shard(pRVar5,"ref_geom_topo_error");
              if (uVar6 == 0) {
                pcVar13 = "geom edge missing edge";
                uVar11 = 0x7cd;
                goto LAB_00156fc9;
              }
              pcVar13 = "geom tec";
              uVar11 = 0x7cc;
            }
            else {
              pcVar13 = "tattle";
              uVar11 = 0x7ca;
            }
            goto LAB_00156ebc;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar19) {
          if (pRVar1->ref_mpi->id != pRVar1->part[uVar17]) {
            bVar4 = true;
            bVar14 = false;
            goto LAB_001566e3;
          }
          uVar6 = ref_grid_tattle(pRVar5,node);
          if (uVar6 == 0) {
            uVar6 = ref_geom_tec_para_shard(pRVar5,"ref_geom_topo_error");
            if (uVar6 == 0) {
              pcVar13 = "geom edge missing tri or qua";
              uVar11 = 0x7d3;
              goto LAB_00156fc9;
            }
            pcVar13 = "geom tec";
            uVar11 = 0x7d2;
          }
          else {
            pcVar13 = "tattle";
            uVar11 = 2000;
          }
          goto LAB_00156ebc;
        }
        bVar4 = true;
        bVar14 = false;
      }
      else {
        pRVar2 = pRVar5->cell[2]->ref_adj;
        if ((long)uVar17 < (long)pRVar2->nnode) {
          bVar18 = pRVar2->first[uVar17] == -1;
          goto LAB_0015661e;
        }
        if (geom_node != 0) goto LAB_00156666;
        RVar8 = 0;
        if (geom_edge != 0) goto LAB_001566a3;
        bVar14 = true;
        bVar4 = false;
        bVar18 = true;
LAB_001566e3:
        if (((bool)(geom_face != 0 & bVar19)) && (pRVar1->ref_mpi->id == pRVar1->part[uVar17])) {
          puts("no face for geom");
          uVar6 = ref_grid_tattle(pRVar5,node);
          if (uVar6 == 0) {
            uVar6 = ref_geom_tec_para_shard(pRVar5,"ref_geom_topo_error");
            if (uVar6 == 0) {
              pcVar13 = "geom face missing tri or qua";
              uVar11 = 0x7dc;
              goto LAB_00156fc9;
            }
            pcVar13 = "geom tec";
            uVar11 = 0x7db;
          }
          else {
            pcVar13 = "tattle";
            uVar11 = 0x7d9;
          }
          goto LAB_00156ebc;
        }
        if (!bVar18 && !bVar4) {
          puts("no geom for edge");
          uVar6 = ref_grid_tattle(pRVar5,node);
          if (uVar6 == 0) {
            uVar6 = ref_geom_tec_para_shard(pRVar5,"ref_geom_topo_error");
            if (uVar6 == 0) {
              pcVar13 = "geom edge missing for edg";
              uVar11 = 0x7e5;
              goto LAB_00156fc9;
            }
            pcVar13 = "geom tec";
            uVar11 = 0x7e4;
          }
          else {
            pcVar13 = "tattle";
            uVar11 = 0x7e2;
          }
          goto LAB_00156ebc;
        }
      }
      if ((!bVar19 && geom_face == 0) && (ref_geom->meshlink == (void *)0x0)) {
        puts("no geom for face");
        uVar6 = ref_grid_tattle(pRVar5,node);
        if (uVar6 == 0) {
          uVar6 = ref_geom_tec_para_shard(pRVar5,"ref_geom_topo_error");
          if (uVar6 == 0) {
            pcVar13 = "geom face missing tri or qua";
            uVar11 = 0x7ee;
LAB_00156fc9:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar11,"ref_geom_verify_topo",pcVar13);
            return 1;
          }
          pcVar13 = "geom tec";
          uVar11 = 0x7ed;
        }
        else {
          pcVar13 = "tattle";
          uVar11 = 0x7eb;
        }
        goto LAB_00156ebc;
      }
      if (!bVar14 && RVar8 == 0) {
        pRVar2 = ref_geom->ref_adj;
        uVar9 = 0xffffffff;
        RVar12 = -1;
        if ((long)uVar17 < (long)pRVar2->nnode) {
          uVar6 = pRVar2->first[uVar17];
          uVar9 = 0xffffffff;
          RVar12 = -1;
          if ((long)(int)uVar6 != -1) {
            RVar12 = pRVar2->item[(int)uVar6].ref;
            uVar9 = (ulong)uVar6;
          }
        }
        bVar19 = false;
        bVar18 = false;
        while ((int)uVar9 != -1) {
          bVar14 = true;
          if (!bVar18) {
            bVar14 = bVar19;
          }
          if (ref_geom->descr[RVar12 * 6] == 1) {
            bVar18 = true;
            bVar19 = bVar14;
          }
          uVar9 = (ulong)pRVar2->item[(int)uVar9].next;
          RVar12 = -1;
          if (uVar9 != 0xffffffffffffffff) {
            RVar12 = pRVar2->item[uVar9].ref;
          }
        }
        if ((!bVar18) || (bVar19)) {
          if (!bVar18) {
            puts("none found");
          }
          if (bVar19) {
            puts("found too many");
          }
          pRVar5 = local_48;
          uVar6 = ref_grid_tattle(local_48,node);
          if (uVar6 == 0) {
            uVar6 = ref_geom_tec_para_shard(pRVar5,"ref_geom_topo_error");
            if (uVar6 == 0) {
              pcVar13 = "multiple geom edge away from geom node";
              uVar11 = 0x800;
              goto LAB_00156fc9;
            }
            pcVar13 = "geom tec";
            uVar11 = 0x7ff;
          }
          else {
            pcVar13 = "tatt";
            uVar11 = 0x7fd;
          }
          goto LAB_00156ebc;
        }
      }
      if (!(bool)(bVar4 | geom_face == 0)) {
        pRVar2 = ref_geom->ref_adj;
        uVar9 = 0xffffffff;
        RVar12 = -1;
        if ((long)uVar17 < (long)pRVar2->nnode) {
          uVar6 = pRVar2->first[uVar17];
          uVar9 = 0xffffffff;
          RVar12 = -1;
          if ((long)(int)uVar6 != -1) {
            RVar12 = pRVar2->item[(int)uVar6].ref;
            uVar9 = (ulong)uVar6;
          }
        }
        bVar18 = false;
        bVar19 = false;
        while ((int)uVar9 != -1) {
          bVar4 = true;
          if (!bVar19) {
            bVar4 = bVar18;
          }
          if (ref_geom->descr[RVar12 * 6] == 2) {
            bVar19 = true;
            bVar18 = bVar4;
          }
          uVar9 = (ulong)pRVar2->item[(int)uVar9].next;
          RVar12 = -1;
          if (uVar9 != 0xffffffffffffffff) {
            RVar12 = pRVar2->item[uVar9].ref;
          }
        }
        if ((!bVar19) || (bVar18)) {
          if (!bVar19) {
            puts("none found");
          }
          if (bVar18) {
            puts("found too many");
          }
          pRVar5 = local_48;
          uVar6 = ref_grid_tattle(local_48,node);
          if (uVar6 == 0) {
            uVar6 = ref_geom_tec_para_shard(pRVar5,"ref_geom_topo_error");
            if (uVar6 == 0) {
              pcVar13 = "multiple geom face away from geom edge";
              uVar11 = 0x813;
              goto LAB_00156fc9;
            }
            pcVar13 = "geom tec";
            uVar11 = 0x812;
          }
          else {
            pcVar13 = "tattle";
            uVar11 = 0x810;
          }
          goto LAB_00156ebc;
        }
      }
    }
  }
  ref_cell = local_48->cell[0];
  iVar15 = 0;
  do {
    if (ref_cell->max <= iVar15) {
      return 0;
    }
    lVar16 = (long)iVar15;
    lVar10 = ref_cell->size_per * lVar16;
    node0 = ref_cell->c2n[lVar10];
    if (node0 != -1) {
      uVar6 = ref_cell_list_with2(ref_cell,node0,ref_cell->c2n[lVar10 + 1],2,&ncell,cell_list);
      if (uVar6 != 0) {
        pcVar13 = "edge list for edge";
        uVar11 = 0x821;
        goto LAB_00156ebc;
      }
      if (ncell == 2) {
        puts("error: two edg found with same nodes");
        pRVar3 = ref_cell->c2n;
        lVar10 = (long)ref_cell->size_per * (long)cell_list[0];
        printf("edg %d n %d %d id %d\n",(long)cell_list[0],(ulong)(uint)pRVar3[lVar10],
               (ulong)(uint)pRVar3[lVar10 + 1],(ulong)(uint)pRVar3[lVar10 + 2]);
        pRVar3 = ref_cell->c2n;
        lVar10 = (long)ref_cell->size_per * (long)cell_list[1];
        printf("edg %d n %d %d id %d\n",(long)cell_list[1],(ulong)(uint)pRVar3[lVar10],
               (ulong)(uint)pRVar3[lVar10 + 1],(ulong)(uint)pRVar3[lVar10 + 2]);
        uVar6 = ref_grid_tattle(pRVar5,ref_cell->c2n[ref_cell->size_per * lVar16]);
        if (uVar6 != 0) {
          pcVar13 = "tattle";
          uVar11 = 0x82c;
LAB_00156ebc:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 uVar11,"ref_geom_verify_topo",(ulong)uVar6,pcVar13);
          return uVar6;
        }
        uVar6 = ref_grid_tattle(pRVar5,ref_cell->c2n[ref_cell->size_per * lVar16 + 1]);
        if (uVar6 != 0) {
          pcVar13 = "tattle";
          uVar11 = 0x82d;
          goto LAB_00156ebc;
        }
        uVar6 = ref_geom_tec_para_shard(pRVar5,"ref_geom_topo_error");
        if (uVar6 != 0) {
          pcVar13 = "geom tec";
          uVar11 = 0x82e;
          goto LAB_00156ebc;
        }
      }
      if (ncell != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x830,"ref_geom_verify_topo","expect only one edge cell for two nodes",1,(long)ncell)
        ;
        return 1;
      }
    }
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_verify_topo(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT item, geom;
  REF_BOOL geom_node, geom_edge, geom_face;
  REF_BOOL no_face, no_edge;
  REF_BOOL found_one;
  REF_BOOL found_too_many;
  REF_INT cell, ncell, cell_list[2];

  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (ref_node_valid(ref_node, node)) {
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node");
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge");
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face");
      no_face = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_tr2(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_tr3(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_qua(ref_grid), node);
      no_edge = ref_cell_node_empty(ref_grid_edg(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_ed2(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_ed3(ref_grid), node);
      if (geom_node) {
        if (no_edge && ref_node_owned(ref_node, node)) {
          THROW("geom node missing edge");
        }
        if (no_face && ref_node_owned(ref_node, node)) {
          THROW("geom node missing tri or qua");
        }
      }
      if (geom_edge) {
        if (no_edge && ref_node_owned(ref_node, node)) {
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing edge");
        }
        if (no_face && ref_node_owned(ref_node, node)) {
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing tri or qua");
        }
      }
      if (geom_face) {
        if (no_face && ref_node_owned(ref_node, node)) {
          printf("no face for geom\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom face missing tri or qua");
        }
      }
      if (!no_edge) {
        if (!geom_edge) {
          printf("no geom for edge\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing for edg");
        }
      }
      if (!no_face) {
        if (!geom_face && !ref_geom_meshlinked(ref_geom)) {
          printf("no geom for face\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom face missing tri or qua");
        }
      }
      if (geom_edge && !geom_node) {
        found_one = REF_FALSE;
        found_too_many = REF_FALSE;
        each_ref_geom_having_node(ref_geom, node, item, geom) {
          if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
            if (found_one) found_too_many = REF_TRUE;
            found_one = REF_TRUE;
          }
        }
        if (!found_one || found_too_many) {
          if (!found_one) printf("none found\n");
          if (found_too_many) printf("found too many\n");
          RSS(ref_grid_tattle(ref_grid, node), "tatt");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("multiple geom edge away from geom node");
        }
      }
      if (geom_face && !geom_edge) {
        found_one = REF_FALSE;
        found_too_many = REF_FALSE;
        each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item,
                                        geom) {
          if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
            if (found_one) found_too_many = REF_TRUE;
            found_one = REF_TRUE;
          }
        }
        if (!found_one || found_too_many) {
          if (!found_one) printf("none found\n");
          if (found_too_many) printf("found too many\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("multiple geom face away from geom edge");
        }
      }
    } else {
      if (!ref_adj_empty(ref_geom_adj(ref_geom), node))
        THROW("invalid node has geom");
    }
  }

  ref_cell = ref_grid_edg(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_list_with2(ref_cell, ref_cell_c2n(ref_cell, 0, cell),
                            ref_cell_c2n(ref_cell, 1, cell), 2, &ncell,
                            cell_list),
        "edge list for edge");
    if (2 == ncell) {
      printf("error: two edg found with same nodes\n");
      printf("edg %d n %d %d id %d\n", cell_list[0],
             ref_cell_c2n(ref_cell, 0, cell_list[0]),
             ref_cell_c2n(ref_cell, 1, cell_list[0]),
             ref_cell_c2n(ref_cell, 2, cell_list[0]));
      printf("edg %d n %d %d id %d\n", cell_list[1],
             ref_cell_c2n(ref_cell, 0, cell_list[1]),
             ref_cell_c2n(ref_cell, 1, cell_list[1]),
             ref_cell_c2n(ref_cell, 2, cell_list[1]));
      RSS(ref_grid_tattle(ref_grid, ref_cell_c2n(ref_cell, 0, cell)), "tattle");
      RSS(ref_grid_tattle(ref_grid, ref_cell_c2n(ref_cell, 1, cell)), "tattle");
      RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"), "geom tec");
    }
    REIS(1, ncell, "expect only one edge cell for two nodes");
  }

  return REF_SUCCESS;
}